

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::read_sos_marker(jpeg_decoder *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int cc;
  int c;
  int n;
  int ci;
  int i;
  uint num_left;
  jpeg_decoder *this_local;
  
  uVar1 = get_bits(this,0x10);
  uVar2 = get_bits(this,8);
  this->m_comps_in_scan = uVar2;
  ci = uVar1 - 3;
  if (((ci != uVar2 * 2 + 3) || ((int)uVar2 < 1)) || (4 < (int)uVar2)) {
    stop_decoding(this,JPGD_BAD_SOS_LENGTH);
  }
  n = 0;
  while( true ) {
    if ((int)uVar2 <= n) {
      uVar1 = get_bits(this,8);
      this->m_spectral_start = uVar1;
      uVar1 = get_bits(this,8);
      this->m_spectral_end = uVar1;
      uVar1 = get_bits(this,4);
      this->m_successive_high = uVar1;
      uVar1 = get_bits(this,4);
      this->m_successive_low = uVar1;
      if (this->m_progressive_flag == 0) {
        this->m_spectral_start = 0;
        this->m_spectral_end = 0x3f;
      }
      for (ci = ci + -3; ci != 0; ci = ci + -1) {
        get_bits(this,8);
      }
      return;
    }
    uVar1 = get_bits(this,8);
    uVar3 = get_bits(this,8);
    ci = ci + -2;
    for (c = 0; (c < this->m_comps_in_frame && (uVar1 != this->m_comp_ident[c])); c = c + 1) {
    }
    if (this->m_comps_in_frame <= c) {
      stop_decoding(this,JPGD_BAD_SOS_COMP_ID);
    }
    if (3 < c) {
      stop_decoding(this,JPGD_DECODE_ERROR);
    }
    this->m_comp_list[n] = c;
    this->m_comp_dc_tab[c] = (int)uVar3 >> 4 & 0xf;
    this->m_comp_ac_tab[c] = (uVar3 & 0xf) + 4;
    if (7 < this->m_comp_dc_tab[c]) break;
    if (7 < this->m_comp_ac_tab[c]) {
      stop_decoding(this,JPGD_DECODE_ERROR);
    }
    n = n + 1;
  }
  stop_decoding(this,JPGD_DECODE_ERROR);
}

Assistant:

void jpeg_decoder::read_sos_marker()
	{
		uint num_left;
		int i, ci, n, c, cc;

		num_left = get_bits(16);

		n = get_bits(8);

		m_comps_in_scan = n;

		num_left -= 3;

		if ((num_left != (uint)(n * 2 + 3)) || (n < 1) || (n > JPGD_MAX_COMPS_IN_SCAN))
			stop_decoding(JPGD_BAD_SOS_LENGTH);

		for (i = 0; i < n; i++)
		{
			cc = get_bits(8);
			c = get_bits(8);
			num_left -= 2;

			for (ci = 0; ci < m_comps_in_frame; ci++)
				if (cc == m_comp_ident[ci])
					break;

			if (ci >= m_comps_in_frame)
				stop_decoding(JPGD_BAD_SOS_COMP_ID);

			if (ci >= JPGD_MAX_COMPONENTS)
				stop_decoding(JPGD_DECODE_ERROR);

			m_comp_list[i] = ci;

			m_comp_dc_tab[ci] = (c >> 4) & 15;
			m_comp_ac_tab[ci] = (c & 15) + (JPGD_MAX_HUFF_TABLES >> 1);

			if (m_comp_dc_tab[ci] >= JPGD_MAX_HUFF_TABLES)
				stop_decoding(JPGD_DECODE_ERROR);

			if (m_comp_ac_tab[ci] >= JPGD_MAX_HUFF_TABLES)
				stop_decoding(JPGD_DECODE_ERROR);
		}

		m_spectral_start = get_bits(8);
		m_spectral_end = get_bits(8);
		m_successive_high = get_bits(4);
		m_successive_low = get_bits(4);

		if (!m_progressive_flag)
		{
			m_spectral_start = 0;
			m_spectral_end = 63;
		}

		num_left -= 3;

		/* read past whatever is num_left */
		while (num_left)
		{
			get_bits(8);
			num_left--;
		}
	}